

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetSymbolFromPropertyId(JsPropertyIdRef propertyId,JsValueRef *symbol)

{
  anon_class_16_2_0dc2afe1 fn;
  JsErrorCode JVar1;
  JsValueRef *local_18;
  JsValueRef *symbol_local;
  JsPropertyIdRef propertyId_local;
  
  fn.symbol = &local_18;
  fn.propertyId = &symbol_local;
  local_18 = symbol;
  symbol_local = (JsValueRef *)propertyId;
  JVar1 = ContextAPINoScriptWrapper<JsGetSymbolFromPropertyId::__0>(fn,false,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetSymbolFromPropertyId(_In_ JsPropertyIdRef propertyId, _Out_ JsValueRef *symbol)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(symbol);
        *symbol = nullptr;

        Js::PropertyRecord const * propertyRecord = (Js::PropertyRecord const *)propertyId;
        if (!propertyRecord->IsSymbol())
        {
            return JsErrorPropertyNotSymbol;
        }

        *symbol = scriptContext->GetSymbol(propertyRecord);
        return JsNoError;
    });
}